

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

ShaderProgramDeclaration *
deqp::gls::ContextShaderProgram::createProgramDeclaration
          (ShaderProgramDeclaration *__return_storage_ptr__,RenderContext *ctx,
          vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays)

{
  int iVar1;
  GenericVecType type_;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays_00;
  const_reference ppCVar2;
  RenderContext *ctx_00;
  allocator<char> local_1f1;
  string local_1f0;
  Uniform local_1d0;
  allocator<char> local_1a1;
  string local_1a0;
  Uniform local_180;
  string local_158;
  FragmentSource local_138;
  string local_118;
  VertexSource local_f8;
  FragmentOutput local_d8;
  VertexToFragmentVarying local_d4;
  OutputType local_cc;
  string local_c8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  VertexAttribute local_50;
  int local_28;
  undefined1 local_21;
  int arrayNdx;
  vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *arrays_local;
  RenderContext *ctx_local;
  ShaderProgramDeclaration *decl;
  
  local_21 = 0;
  _arrayNdx = arrays;
  arrays_local = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)
                 ctx;
  ctx_local = (RenderContext *)__return_storage_ptr__;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(__return_storage_ptr__);
  for (local_28 = 0; iVar1 = local_28,
      arrays_00 = (vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_> *)
                  std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                  ::size(_arrayNdx), iVar1 < (int)arrays_00; local_28 = local_28 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"a_",&local_91);
    de::toString<int>(&local_c8,&local_28);
    std::operator+(&local_70,&local_90,&local_c8);
    ppCVar2 = std::vector<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>::
              operator[](_arrayNdx,(long)local_28);
    local_cc = (*((*ppCVar2)->super_Array)._vptr_Array[10])();
    type_ = mapOutputType(&local_cc);
    sglr::pdec::VertexAttribute::VertexAttribute(&local_50,&local_70,type_);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_50);
    sglr::pdec::VertexAttribute::~VertexAttribute(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_d4,GENERICVECTYPE_FLOAT,0);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_d4);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_d8,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_d8);
  genVertexSource_abi_cxx11_
            (&local_118,(ContextShaderProgram *)arrays_local,(RenderContext *)_arrayNdx,arrays_00);
  sglr::pdec::VertexSource::VertexSource(&local_f8,&local_118);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_f8);
  sglr::pdec::VertexSource::~VertexSource(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  genFragmentSource_abi_cxx11_(&local_158,(ContextShaderProgram *)arrays_local,ctx_00);
  sglr::pdec::FragmentSource::FragmentSource(&local_138,&local_158);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_138);
  sglr::pdec::FragmentSource::~FragmentSource(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"u_coordScale",&local_1a1)
  ;
  sglr::pdec::Uniform::Uniform(&local_180,&local_1a0,TYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_180);
  sglr::pdec::Uniform::~Uniform(&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"u_colorScale",&local_1f1)
  ;
  sglr::pdec::Uniform::Uniform(&local_1d0,&local_1f0,TYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_1d0);
  sglr::pdec::Uniform::~Uniform(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  return __return_storage_ptr__;
}

Assistant:

sglr::pdec::ShaderProgramDeclaration ContextShaderProgram::createProgramDeclaration (const glu::RenderContext& ctx, const std::vector<ContextArray*>& arrays)
{
	sglr::pdec::ShaderProgramDeclaration decl;

	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
		decl << sglr::pdec::VertexAttribute(std::string("a_") + de::toString(arrayNdx), mapOutputType(arrays[arrayNdx]->getOutputType()));

	decl << sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT);

	decl << sglr::pdec::VertexSource(genVertexSource(ctx, arrays));
	decl << sglr::pdec::FragmentSource(genFragmentSource(ctx));

	decl << sglr::pdec::Uniform("u_coordScale", glu::TYPE_FLOAT);
	decl << sglr::pdec::Uniform("u_colorScale", glu::TYPE_FLOAT);

	return decl;
}